

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O2

int htmlSaveFile(char *filename,xmlDocPtr cur)

{
  int iVar1;
  xmlChar *encoding;
  xmlCharEncodingHandler *encoder;
  xmlOutputBufferPtr buf;
  char *encoding_00;
  
  if (filename == (char *)0x0 || cur == (xmlDocPtr)0x0) {
    iVar1 = -1;
  }
  else {
    xmlInitParser();
    encoding = htmlGetMetaEncoding(cur);
    encoder = htmlFindOutputEncoder((char *)encoding);
    buf = xmlOutputBufferCreateFilename(filename,encoder,cur->compression);
    if (buf != (xmlOutputBufferPtr)0x0) {
      htmlDocContentDumpOutput(buf,cur,encoding_00);
      iVar1 = xmlOutputBufferClose(buf);
      return iVar1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
htmlSaveFile(const char *filename, xmlDocPtr cur) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;
    int ret;

    if ((cur == NULL) || (filename == NULL))
        return(-1);

    xmlInitParser();

    encoding = (const char *) htmlGetMetaEncoding(cur);
    handler = htmlFindOutputEncoder(encoding);
    buf = xmlOutputBufferCreateFilename(filename, handler, cur->compression);
    if (buf == NULL)
        return(0);

    htmlDocContentDumpOutput(buf, cur, NULL);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}